

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O2

void __thiscall script_p2sh_tests::sign::test_method(sign *this)

{
  uint uVar1;
  long lVar2;
  pointer pCVar3;
  pointer pCVar4;
  undefined8 uVar5;
  bool bVar6;
  long lVar7;
  CScript *pCVar8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  CMutableTransaction *assertion_descr;
  iterator in_R8;
  iterator pvVar9;
  int *args_1;
  iterator in_R9;
  iterator pvVar10;
  int i;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other_00;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar11;
  PrecomputedTransactionData *txdataIn;
  char *local_b08;
  char *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  assertion_result local_ac8;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  char *local_aa0;
  char *local_a98;
  int local_a90;
  int local_a8c;
  char *local_a88;
  char *local_a80;
  undefined1 *local_a78;
  undefined1 *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  undefined1 *local_a48;
  undefined1 *local_a40;
  char *local_a38;
  char *local_a30;
  CMutableTransaction txFrom;
  char *local_9f0;
  char *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  undefined1 *local_9b0;
  undefined1 *local_9a8;
  char *local_9a0;
  char *local_998;
  undefined1 local_990 [16];
  undefined1 *local_980;
  undefined8 local_978;
  CScriptCheck local_910;
  CScript sigSave;
  PrecomputedTransactionData txdata;
  SignatureCache signature_cache;
  _Rb_tree_node_base local_610;
  size_t local_5f0;
  _Rb_tree_node_base local_5e0;
  size_t local_5c0;
  pointer puStack_5b8;
  pointer local_5b0;
  pointer puStack_5a8;
  _Rb_tree_node_base local_598;
  size_t local_578;
  _Rb_tree_node_base local_568;
  size_t local_548;
  _Rb_tree_node_base local_538;
  size_t local_518;
  pointer pCStack_510;
  pointer local_508;
  pointer pCStack_500;
  pointer local_4f8;
  pointer pCStack_4f0;
  pointer local_4e8;
  uchar auStack_4e0 [64];
  _Rb_tree_node_base local_4a0;
  size_t local_480;
  _Rb_tree_node_base local_470;
  size_t local_450;
  _Rb_tree_node_base local_440;
  size_t local_420;
  _Rb_tree_node_base local_410;
  size_t local_3f0;
  CMutableTransaction txTo [8];
  string reason;
  CScript evalScripts [4];
  CScript standardScripts [4];
  CKey key [4];
  FillableSigningProvider keystore;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_01158ee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  lVar7 = 0;
  do {
    (&key[0].fCompressed)[lVar7] = false;
    *(undefined8 *)
     ((long)&key[0].keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> + lVar7) = 0;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x40);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    CKey::MakeNewKey((CKey *)(&key[0].fCompressed + lVar7),true);
    local_9a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_998 = "";
    local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x47;
    file.m_begin = (iterator)&local_9a0;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_9b0,msg);
    bVar6 = FillableSigningProvider::AddKey(&keystore,(CKey *)(&key[0].fCompressed + lVar7));
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT71(txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,bVar6);
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         anon_var_dwarf_a20b3e;
    txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)"keystore.AddKey(key[i])" + 0x17;
    signature_cache.m_salted_hasher_ecdsa.s._8_8_ =
         signature_cache.m_salted_hasher_ecdsa.s._8_8_ & 0xffffffffffffff00;
    signature_cache.m_salted_hasher_ecdsa.s._0_8_ = &PTR__lazy_ostream_011481f0;
    signature_cache.m_salted_hasher_ecdsa.s._16_8_ = boost::unit_test::lazy_ostream::inst;
    signature_cache.m_salted_hasher_ecdsa.s._24_8_ = &txdata;
    local_9c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_9b8 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)txTo,(lazy_ostream *)&signature_cache,1,0,WARN,_cVar11,
               (size_t)&local_9c0,0x47);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  standardScripts[3].super_CScriptBase._union._16_8_ = 0;
  standardScripts[3].super_CScriptBase._24_8_ = 0;
  standardScripts[3].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  standardScripts[3].super_CScriptBase._union._8_8_ = 0;
  standardScripts[2].super_CScriptBase._union._16_8_ = 0;
  standardScripts[2].super_CScriptBase._24_8_ = 0;
  standardScripts[2].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  standardScripts[2].super_CScriptBase._union._8_8_ = 0;
  standardScripts[1].super_CScriptBase._union._16_8_ = 0;
  standardScripts[1].super_CScriptBase._24_8_ = 0;
  standardScripts[1].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  standardScripts[1].super_CScriptBase._union._8_8_ = 0;
  standardScripts[0].super_CScriptBase._union._16_8_ = 0;
  standardScripts[0].super_CScriptBase._24_8_ = 0;
  standardScripts[0].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  standardScripts[0].super_CScriptBase._union._8_8_ = 0;
  CKey::GetPubKey((CPubKey *)&signature_cache,key);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)txTo,
             (CPubKey *)&signature_cache);
  pCVar8 = CScript::operator<<(standardScripts,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)txTo);
  CScript::operator<<(pCVar8,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)txTo);
  CKey::GetPubKey((CPubKey *)txTo,key + 1);
  PKHash::PKHash((PKHash *)evalScripts,(CPubKey *)txTo);
  signature_cache.m_salted_hasher_ecdsa.s[4] = evalScripts[0].super_CScriptBase._union._16_4_;
  signature_cache.m_salted_hasher_ecdsa.s._0_8_ =
       evalScripts[0].super_CScriptBase._union.indirect_contents.indirect;
  signature_cache.m_salted_hasher_ecdsa.s[2] = evalScripts[0].super_CScriptBase._union._8_4_;
  signature_cache.m_salted_hasher_ecdsa.s[3] = evalScripts[0].super_CScriptBase._union._12_4_;
  signature_cache.m_salted_hasher_ecdsa.buf[0x28] = '\x02';
  GetScriptForDestination((CScript *)&txdata,(CTxDestination *)&signature_cache);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&standardScripts[1].super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txdata);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txdata);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&signature_cache);
  CKey::GetPubKey((CPubKey *)&signature_cache,key + 1);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)txTo,
             (CPubKey *)&signature_cache);
  pCVar8 = CScript::operator<<(standardScripts + 2,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)txTo);
  CScript::operator<<(pCVar8,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)txTo);
  CKey::GetPubKey((CPubKey *)txTo,key + 2);
  other_00 = &evalScripts[0].super_CScriptBase;
  PKHash::PKHash((PKHash *)other_00,(CPubKey *)txTo);
  signature_cache.m_salted_hasher_ecdsa.s[4] = evalScripts[0].super_CScriptBase._union._16_4_;
  signature_cache.m_salted_hasher_ecdsa.s._0_8_ =
       evalScripts[0].super_CScriptBase._union.indirect_contents.indirect;
  signature_cache.m_salted_hasher_ecdsa.s[2] = evalScripts[0].super_CScriptBase._union._8_4_;
  signature_cache.m_salted_hasher_ecdsa.s[3] = evalScripts[0].super_CScriptBase._union._12_4_;
  signature_cache.m_salted_hasher_ecdsa.buf[0x28] = '\x02';
  GetScriptForDestination((CScript *)&txdata,(CTxDestination *)&signature_cache);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&standardScripts[3].super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txdata);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txdata);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&signature_cache);
  evalScripts[3].super_CScriptBase._union._16_8_ = 0;
  evalScripts[3].super_CScriptBase._24_8_ = 0;
  evalScripts[3].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  evalScripts[3].super_CScriptBase._union._8_8_ = 0;
  evalScripts[2].super_CScriptBase._union._16_8_ = 0;
  evalScripts[2].super_CScriptBase._24_8_ = 0;
  evalScripts[2].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  evalScripts[2].super_CScriptBase._union._8_8_ = 0;
  evalScripts[1].super_CScriptBase._union._16_8_ = 0;
  evalScripts[1].super_CScriptBase._24_8_ = 0;
  evalScripts[1].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  evalScripts[1].super_CScriptBase._union._8_8_ = 0;
  evalScripts[0].super_CScriptBase._union._16_8_ = 0;
  evalScripts[0].super_CScriptBase._24_8_ = 0;
  evalScripts[0].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  evalScripts[0].super_CScriptBase._union._8_8_ = 0;
  for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 0x20) {
    local_9d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_9c8 = "";
    local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x54;
    file_00.m_begin = (iterator)&local_9d0;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_9e0,
               msg_00);
    pCVar8 = (CScript *)((long)&standardScripts[0].super_CScriptBase._union + lVar7);
    bVar6 = FillableSigningProvider::AddCScript(&keystore,pCVar8);
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT71(txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,bVar6);
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         anon_var_dwarf_e377cf;
    txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)"keystore.AddCScript(standardScripts[i])" + 0x27;
    signature_cache.m_salted_hasher_ecdsa.s._8_8_ =
         signature_cache.m_salted_hasher_ecdsa.s._8_8_ & 0xffffffffffffff00;
    signature_cache.m_salted_hasher_ecdsa.s._0_8_ = &PTR__lazy_ostream_011481f0;
    signature_cache.m_salted_hasher_ecdsa.s._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_9f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_9e8 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    signature_cache.m_salted_hasher_ecdsa.s._24_8_ = &txdata;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)txTo,(lazy_ostream *)&signature_cache,1,0,WARN,_cVar11,
               (size_t)&local_9f0,0x54);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ScriptHash::ScriptHash((ScriptHash *)&txdata,pCVar8);
    uVar5 = txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
    signature_cache.m_salted_hasher_ecdsa.s[4]._0_1_ =
         txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10];
    signature_cache.m_salted_hasher_ecdsa.s[4]._1_1_ =
         txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11];
    signature_cache.m_salted_hasher_ecdsa.s[4]._2_1_ =
         txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12];
    signature_cache.m_salted_hasher_ecdsa.s[4]._3_1_ =
         txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13];
    signature_cache.m_salted_hasher_ecdsa.s._0_8_ =
         txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
    signature_cache.m_salted_hasher_ecdsa.s._8_8_ =
         txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
    signature_cache.m_salted_hasher_ecdsa.buf[0x28] = '\x03';
    txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar5;
    GetScriptForDestination((CScript *)txTo,(CTxDestination *)&signature_cache);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&evalScripts[0].super_CScriptBase._union + lVar7),
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)txTo);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)txTo);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&signature_cache);
  }
  CMutableTransaction::CMutableTransaction(&txFrom);
  reason._M_dataplus._M_p = (pointer)&reason.field_2;
  reason._M_string_length = 0;
  reason.field_2._M_local_buf[0] = '\0';
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txFrom.vout,8);
  other = &standardScripts[0].super_CScriptBase;
  for (lVar7 = 8; lVar7 != 0xa8; lVar7 = lVar7 + 0x28) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&(txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue + lVar7),other_00);
    *(undefined8 *)
     ((long)txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start + lVar7 + -8) = 100000000;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start[4].nValue + lVar7),other);
    *(undefined8 *)
     ((long)&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start[3].scriptPubKey.super_CScriptBase._union +
     lVar7 + 0x18) = 100000000;
    other = other + 1;
    other_00 = other_00 + 1;
  }
  local_a38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_a30 = "";
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x62;
  file_01.m_begin = (iterator)&local_a38;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_a48,
             msg_01);
  CTransaction::CTransaction((CTransaction *)&signature_cache,&txFrom);
  bVar6 = IsStandardTx((CTransaction *)&signature_cache,&reason);
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = bVar6;
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  txTo[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_990;
  local_990._0_8_ = "IsStandardTx(CTransaction(txFrom), reason)";
  local_990._8_8_ = "";
  assertion_descr = txTo;
  txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                               .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_011481f0;
  txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_a58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_a50 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&txdata,(lazy_ostream *)assertion_descr,1,0,WARN,_cVar11,
             (size_t)&local_a58,0x62);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  CTransaction::~CTransaction((CTransaction *)&signature_cache);
  lVar7 = 0;
  do {
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7));
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0x1c0);
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&assertion_descr->vin,1);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&assertion_descr->vout,1);
    (((assertion_descr->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).n = (uint32_t)lVar7;
    CMutableTransaction::GetHash((Txid *)&signature_cache,&txFrom);
    pCVar3 = (assertion_descr->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&(pCVar3->prevout).hash + 0x10) =
         signature_cache.m_salted_hasher_ecdsa.s._16_8_;
    *(undefined8 *)((long)&(pCVar3->prevout).hash + 0x18) =
         signature_cache.m_salted_hasher_ecdsa.s._24_8_;
    *(undefined8 *)&(pCVar3->prevout).hash = signature_cache.m_salted_hasher_ecdsa.s._0_8_;
    *(undefined8 *)((long)&(pCVar3->prevout).hash + 8) =
         signature_cache.m_salted_hasher_ecdsa.s._8_8_;
    ((assertion_descr->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
     super__Vector_impl_data._M_start)->nValue = 1;
    assertion_descr = assertion_descr + 1;
  }
  for (local_ac8._0_4_ = 0; (int)local_ac8._0_4_ < 8; local_ac8._0_4_ = local_ac8._0_4_ + 1) {
    signature_cache.m_salted_hasher_ecdsa.s._0_8_ =
         signature_cache.m_salted_hasher_ecdsa.s._0_8_ & 0xffffffffffff0000;
    signature_cache.m_salted_hasher_schnorr.bytes._0_4_ = 0;
    signature_cache.setValid.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    memset(signature_cache.m_salted_hasher_ecdsa.s + 2,0,0xb8);
    signature_cache.setValid.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&signature_cache.m_salted_hasher_schnorr.bytes;
    signature_cache.setValid.size = 0;
    signature_cache.setValid._28_4_ = 0;
    signature_cache.cs_sigcache._M_impl._M_rwlock.__size[0x28] = '\0';
    local_610._M_color = _S_red;
    local_610._M_parent = (_Base_ptr)0x0;
    local_610._M_left = &local_610;
    local_5f0 = 0;
    local_5e0._M_color = _S_red;
    local_5e0._M_parent = (_Base_ptr)0x0;
    local_5e0._M_left = &local_5e0;
    local_598._M_color = _S_red;
    local_598._M_parent = (_Base_ptr)0x0;
    local_5c0 = 0;
    puStack_5b8 = (pointer)0x0;
    local_5b0 = (pointer)0x0;
    puStack_5a8 = (pointer)0x0;
    local_598._M_left = &local_598;
    local_578 = 0;
    local_568._M_color = _S_red;
    local_568._M_parent = (_Base_ptr)0x0;
    local_568._M_left = &local_568;
    local_548 = 0;
    local_538._M_color = _S_red;
    local_538._M_parent = (_Base_ptr)0x0;
    local_538._M_left = &local_538;
    local_4a0._M_color = _S_red;
    local_4a0._M_parent = (_Base_ptr)0x0;
    local_518 = 0;
    pCStack_510 = (pointer)0x0;
    local_508 = (pointer)0x0;
    pCStack_500 = (pointer)0x0;
    local_4f8 = (pointer)0x0;
    pCStack_4f0 = (pointer)0x0;
    local_4e8 = (pointer)0x0;
    auStack_4e0[0] = '\0';
    auStack_4e0[1] = '\0';
    auStack_4e0[2] = '\0';
    auStack_4e0[3] = '\0';
    auStack_4e0[4] = '\0';
    auStack_4e0[5] = '\0';
    auStack_4e0[6] = '\0';
    auStack_4e0[7] = '\0';
    auStack_4e0[8] = '\0';
    auStack_4e0[9] = '\0';
    auStack_4e0[10] = '\0';
    auStack_4e0[0xb] = '\0';
    auStack_4e0[0xc] = '\0';
    auStack_4e0[0xd] = '\0';
    auStack_4e0[0xe] = '\0';
    auStack_4e0[0xf] = '\0';
    auStack_4e0[0x10] = '\0';
    auStack_4e0[0x11] = '\0';
    auStack_4e0[0x12] = '\0';
    auStack_4e0[0x13] = '\0';
    auStack_4e0[0x14] = '\0';
    auStack_4e0[0x15] = '\0';
    auStack_4e0[0x16] = '\0';
    auStack_4e0[0x17] = '\0';
    auStack_4e0[0x18] = '\0';
    auStack_4e0[0x19] = '\0';
    auStack_4e0[0x1a] = '\0';
    auStack_4e0[0x1b] = '\0';
    auStack_4e0[0x1c] = '\0';
    auStack_4e0[0x1d] = '\0';
    auStack_4e0[0x1e] = '\0';
    auStack_4e0[0x1f] = '\0';
    auStack_4e0[0x20] = '\0';
    auStack_4e0[0x21] = '\0';
    auStack_4e0[0x22] = '\0';
    auStack_4e0[0x23] = '\0';
    auStack_4e0[0x24] = '\0';
    auStack_4e0[0x25] = '\0';
    auStack_4e0[0x26] = '\0';
    auStack_4e0[0x27] = '\0';
    auStack_4e0[0x28] = '\0';
    auStack_4e0[0x29] = '\0';
    auStack_4e0[0x2a] = '\0';
    auStack_4e0[0x2b] = '\0';
    auStack_4e0[0x2c] = '\0';
    auStack_4e0[0x2d] = '\0';
    auStack_4e0[0x2e] = '\0';
    auStack_4e0[0x2f] = '\0';
    auStack_4e0[0x30] = '\0';
    auStack_4e0[0x31] = '\0';
    auStack_4e0[0x32] = '\0';
    auStack_4e0[0x33] = '\0';
    local_4a0._M_left = &local_4a0;
    local_480 = 0;
    local_470._M_color = _S_red;
    local_470._M_parent = (_Base_ptr)0x0;
    local_470._M_left = &local_470;
    local_450 = 0;
    local_440._M_color = _S_red;
    local_440._M_parent = (_Base_ptr)0x0;
    local_440._M_left = &local_440;
    local_420 = 0;
    local_410._M_color = _S_red;
    local_410._M_parent = (_Base_ptr)0x0;
    local_410._M_left = &local_410;
    local_3f0 = 0;
    local_a68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_a60 = "";
    local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a70 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x70;
    file_02.m_begin = (iterator)&local_a68;
    msg_02.m_end = pvVar10;
    msg_02.m_begin = pvVar9;
    signature_cache.setValid.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         signature_cache.setValid.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_610._M_right = local_610._M_left;
    local_5e0._M_right = local_5e0._M_left;
    local_598._M_right = local_598._M_left;
    local_568._M_right = local_568._M_left;
    local_538._M_right = local_538._M_left;
    local_4a0._M_right = local_4a0._M_left;
    local_470._M_right = local_470._M_left;
    local_440._M_right = local_440._M_left;
    local_410._M_right = local_410._M_left;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_a78,
               msg_02);
    CTransaction::CTransaction((CTransaction *)&txdata,&txFrom);
    sigSave.super_CScriptBase._union.direct[0] =
         SignSignature(&keystore.super_SigningProvider,(CTransaction *)&txdata,
                       txTo + (int)local_ac8._0_4_,0,1,(SignatureData *)&signature_cache);
    sigSave.super_CScriptBase._union._8_8_ = 0;
    sigSave.super_CScriptBase._union._16_8_ = 0;
    tinyformat::format<int>((string *)&local_910,"SignSignature %d",(int *)&local_ac8);
    local_990._8_8_ = local_990._8_8_ & 0xffffffffffffff00;
    local_990._0_8_ = &PTR__lazy_ostream_01147fb0;
    local_980 = boost::unit_test::lazy_ostream::inst;
    local_a88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_a80 = "";
    pvVar9 = &DAT_00000001;
    pvVar10 = &DAT_00000001;
    local_978 = &local_910;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&sigSave,(lazy_ostream *)local_990,1,1,WARN,_cVar11,
               (size_t)&local_a88,0x70);
    std::__cxx11::string::~string((string *)&local_910);
    boost::detail::shared_count::~shared_count
              ((shared_count *)((long)&sigSave.super_CScriptBase._union + 0x10));
    CTransaction::~CTransaction((CTransaction *)&txdata);
    SignatureData::~SignatureData((SignatureData *)&signature_cache);
  }
  SignatureCache::SignatureCache(&signature_cache,0x1000000);
  local_a8c = 0;
  while( true ) {
    if (7 < local_a8c) break;
    PrecomputedTransactionData::PrecomputedTransactionData<CMutableTransaction>
              (&txdata,txTo + local_a8c);
    for (local_a90 = 0; local_a90 < 8; local_a90 = local_a90 + 1) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                (&sigSave.super_CScriptBase,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 ((long)txTo[local_a8c].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_start + 0x28));
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 ((long)txTo[local_a8c].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_start + 0x28),
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 ((long)txTo[local_a90].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_start + 0x28));
      pCVar4 = txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = ((txTo[local_a8c].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->prevout).n;
      CTransaction::CTransaction((CTransaction *)local_990,txTo + local_a8c);
      txdataIn = &txdata;
      args_1 = (int *)0x0;
      pvVar9 = (iterator)0x3;
      CScriptCheck::CScriptCheck
                (&local_910,pCVar4 + uVar1,(CTransaction *)local_990,&signature_cache,0,3,false,
                 txdataIn);
      bVar6 = CScriptCheck::operator()(&local_910);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                (&local_910.m_tx_out.scriptPubKey.super_CScriptBase);
      CTransaction::~CTransaction((CTransaction *)local_990);
      if (local_a8c == local_a90) {
        local_aa0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
        ;
        local_a98 = "";
        local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_03.m_end = (iterator)0x7d;
        file_03.m_begin = (iterator)&local_aa0;
        msg_03.m_end = pvVar9;
        msg_03.m_begin = (iterator)args_1;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_ab0
                   ,msg_03);
        local_ac8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)bVar6;
        local_ac8.m_message.px = (element_type *)0x0;
        local_ac8.m_message.pn.pi_ = (sp_counted_base *)0x0;
        tinyformat::format<int,int>
                  ((string *)&local_910,(tinyformat *)"VerifySignature %d %d",(char *)&local_a8c,
                   &local_a90,args_1);
        local_990._8_8_ = local_990._8_8_ & 0xffffffffffffff00;
        local_990._0_8_ = &PTR__lazy_ostream_01147fb0;
        local_980 = boost::unit_test::lazy_ostream::inst;
        local_ad8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
        ;
        local_ad0 = "";
        local_978 = &local_910;
        boost::test_tools::tt_detail::report_assertion
                  (&local_ac8,(lazy_ostream *)local_990,1,1,WARN,(check_type)txdataIn,
                   (size_t)&local_ad8,0x7d);
      }
      else {
        local_ae8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
        ;
        local_ae0 = "";
        local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_04.m_end = (iterator)0x7f;
        file_04.m_begin = (iterator)&local_ae8;
        msg_04.m_end = pvVar9;
        msg_04.m_begin = (iterator)args_1;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_af8
                   ,msg_04);
        local_ac8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)!bVar6;
        local_ac8.m_message.px = (element_type *)0x0;
        local_ac8.m_message.pn.pi_ = (sp_counted_base *)0x0;
        tinyformat::format<int,int>
                  ((string *)&local_910,(tinyformat *)"VerifySignature %d %d",(char *)&local_a8c,
                   &local_a90,args_1);
        local_990._8_8_ = local_990._8_8_ & 0xffffffffffffff00;
        local_990._0_8_ = &PTR__lazy_ostream_01147fb0;
        local_980 = boost::unit_test::lazy_ostream::inst;
        local_b08 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
        ;
        local_b00 = "";
        local_978 = &local_910;
        boost::test_tools::tt_detail::report_assertion
                  (&local_ac8,(lazy_ostream *)local_990,1,1,WARN,(check_type)txdataIn,
                   (size_t)&local_b08,0x7f);
      }
      std::__cxx11::string::~string((string *)&local_910);
      boost::detail::shared_count::~shared_count(&local_ac8.m_message.pn);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 ((long)txTo[local_a8c].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_start + 0x28),&sigSave.super_CScriptBase)
      ;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&sigSave.super_CScriptBase);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
    local_a8c = local_a8c + 1;
  }
  CuckooCache::cache<uint256,_SignatureCacheHasher>::~cache(&signature_cache.setValid);
  lVar7 = 0x188;
  do {
    CMutableTransaction::~CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7));
    lVar7 = lVar7 + -0x38;
  } while (lVar7 != -0x38);
  std::__cxx11::string::~string((string *)&reason);
  CMutableTransaction::~CMutableTransaction(&txFrom);
  lVar7 = 0x60;
  do {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&evalScripts[0].super_CScriptBase._union + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  lVar7 = 0x60;
  do {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&standardScripts[0].super_CScriptBase._union + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  lVar7 = 0x38;
  do {
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   *)(&key[0].fCompressed + lVar7));
    lVar7 = lVar7 + -0x10;
  } while (lVar7 != -8);
  FillableSigningProvider::~FillableSigningProvider(&keystore);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sign)
{
    // Pay-to-script-hash looks like this:
    // scriptSig:    <sig> <sig...> <serialized_script>
    // scriptPubKey: HASH160 <hash> EQUAL

    // Test SignSignature() (and therefore the version of Solver() that signs transactions)
    FillableSigningProvider keystore;
    CKey key[4];
    for (int i = 0; i < 4; i++)
    {
        key[i].MakeNewKey(true);
        BOOST_CHECK(keystore.AddKey(key[i]));
    }

    // 8 Scripts: checking all combinations of
    // different keys, straight/P2SH, pubkey/pubkeyhash
    CScript standardScripts[4];
    standardScripts[0] << ToByteVector(key[0].GetPubKey()) << OP_CHECKSIG;
    standardScripts[1] = GetScriptForDestination(PKHash(key[1].GetPubKey()));
    standardScripts[2] << ToByteVector(key[1].GetPubKey()) << OP_CHECKSIG;
    standardScripts[3] = GetScriptForDestination(PKHash(key[2].GetPubKey()));
    CScript evalScripts[4];
    for (int i = 0; i < 4; i++)
    {
        BOOST_CHECK(keystore.AddCScript(standardScripts[i]));
        evalScripts[i] = GetScriptForDestination(ScriptHash(standardScripts[i]));
    }

    CMutableTransaction txFrom;  // Funding transaction:
    std::string reason;
    txFrom.vout.resize(8);
    for (int i = 0; i < 4; i++)
    {
        txFrom.vout[i].scriptPubKey = evalScripts[i];
        txFrom.vout[i].nValue = COIN;
        txFrom.vout[i+4].scriptPubKey = standardScripts[i];
        txFrom.vout[i+4].nValue = COIN;
    }
    BOOST_CHECK(IsStandardTx(CTransaction(txFrom), reason));

    CMutableTransaction txTo[8]; // Spending transactions
    for (int i = 0; i < 8; i++)
    {
        txTo[i].vin.resize(1);
        txTo[i].vout.resize(1);
        txTo[i].vin[0].prevout.n = i;
        txTo[i].vin[0].prevout.hash = txFrom.GetHash();
        txTo[i].vout[0].nValue = 1;
    }
    for (int i = 0; i < 8; i++)
    {
        SignatureData empty;
        BOOST_CHECK_MESSAGE(SignSignature(keystore, CTransaction(txFrom), txTo[i], 0, SIGHASH_ALL, empty), strprintf("SignSignature %d", i));
    }
    // All of the above should be OK, and the txTos have valid signatures
    // Check to make sure signature verification fails if we use the wrong ScriptSig:
    SignatureCache signature_cache{DEFAULT_SIGNATURE_CACHE_BYTES};
    for (int i = 0; i < 8; i++) {
        PrecomputedTransactionData txdata(txTo[i]);
        for (int j = 0; j < 8; j++)
        {
            CScript sigSave = txTo[i].vin[0].scriptSig;
            txTo[i].vin[0].scriptSig = txTo[j].vin[0].scriptSig;
            bool sigOK = CScriptCheck(txFrom.vout[txTo[i].vin[0].prevout.n], CTransaction(txTo[i]), signature_cache, 0, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_STRICTENC, false, &txdata)();
            if (i == j)
                BOOST_CHECK_MESSAGE(sigOK, strprintf("VerifySignature %d %d", i, j));
            else
                BOOST_CHECK_MESSAGE(!sigOK, strprintf("VerifySignature %d %d", i, j));
            txTo[i].vin[0].scriptSig = sigSave;
        }
    }
}